

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_prevent_healing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  const_reference pvVar2;
  CHAR_DATA *in_RCX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  
  bVar1 = is_affected(in_RCX,in_EDI);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    bVar1 = saves_spell(in_stack_ffffffffffffffb0,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        in_stack_ffffffffffffffa4);
    if (!bVar1) {
      pvVar2 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                         (&race_table,(long)in_RCX->race);
      bVar1 = str_cmp(pvVar2->name,"troll");
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            in_stack_ffffffffffffff68,0);
        init_affect((AFFECT_DATA *)0x62198c);
        affect_to_char(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        return;
      }
    }
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void spell_prevent_healing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, sn))
	{
		send_to_char("Their body is already deficient in healing ability.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER) || !str_cmp(race_table[victim->race].name, "troll"))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	send_to_char("You feel your body losing it's ability to heal.\n\r", victim);
	act("$n looks very sick.", victim, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_prevent_healing;
	af.level = level;
	af.location = 0;
	af.modifier = 0;
	af.duration = level / 6;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);
}